

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  ostream *poVar8;
  _List_node_base *p_Var9;
  _Node *p_Var10;
  _List_node_base *p_Var11;
  long *plVar12;
  undefined8 uVar13;
  ulong uVar14;
  long *plVar15;
  size_type *psVar16;
  long lVar17;
  char *pcVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  _Self __tmp;
  bool debug;
  string tmp;
  string __str;
  string __str_1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  c_word;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  s_name;
  ofstream fout;
  byte local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  _List_node_base *local_2c8;
  _List_node_base *local_2c0;
  _List_node_base *local_2b8;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  _List_node_base *local_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ulong local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                                    _             \tVersion : ",
             0x3d);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,str_ver_abi_cxx11_._M_dataplus._M_p,
                      str_ver_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"   ||  ||      ___ _ __ _   _ _ __ | |_ ___  _ __ \n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "   \\\\()//    / __| \'__| | | | \'_ \\| __/ _ \\| \'__|\tDeveloper : KonstantIMP\n",
             0x4a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "  //(__)\\\\  | (__| |  | |_| | |_) | || (_) | |   \tFeedback email : mihedovkos@gmail.com\n"
             ,0x58);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  ||    ||   \\___|_|   \\__, | .__/ \\__\\___/|_|   \n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                       |___/|_|                  \tUse \"cryptor -h\" to view help message\n\n"
             ,0x59);
  if (argc == 1) {
    return 0;
  }
  local_329 = 0;
  std::ofstream::ofstream(&local_230);
  local_2c8 = (_List_node_base *)&local_2b0;
  p_Var11 = (_List_node_base *)0x0;
  local_2b0._M_impl._M_node._M_size = 0;
  local_298 = (_List_node_base *)&local_270;
  local_2c0 = (_List_node_base *)0x0;
  local_270._M_impl._M_node._M_size = 0;
  local_2b0._M_impl._M_node.super__List_node_base._M_next = local_2c8;
  local_2b0._M_impl._M_node.super__List_node_base._M_prev = local_2c8;
  local_270._M_impl._M_node.super__List_node_base._M_next = local_298;
  local_270._M_impl._M_node.super__List_node_base._M_prev = local_298;
  if (argc < 2) {
    bVar2 = true;
    local_2b8 = (_List_node_base *)0x0;
  }
  else {
    paVar1 = &local_328.field_2;
    iVar20 = 1;
    bVar2 = true;
    local_2b8 = (_List_node_base *)0x0;
    local_2c0 = (_List_node_base *)0x0;
    do {
      pcVar18 = argv[iVar20];
      if (*pcVar18 == '-') {
        if ((pcVar18[1] == 'h') && (pcVar18[2] == '\0')) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"CRYPTOR : version ",0x12);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,str_ver_abi_cxx11_._M_dataplus._M_p,
                              str_ver_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "Cryptor is a simple programm, to encrypt & decrypt text messages\n\n",0x42);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"HELP MANUAL :\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t[USAGE] encryptor [OPTIONS] [WORDS]\n\n",0x26);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[OPTIONS]\n",10)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-d\tView debug output\n",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-v\tView version and exit\n",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-h\tView help message and exit\n",0x1f);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-a\tView (en/de)crypt algorithm and exit\n",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-t\tDon\'t ask about stings names\n",0x21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-o [F]\tSet output file\n\n",0x19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-m [M]\tSet output strings style\n",0x21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t[STRING STYLE MODES]\n",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t\tC\tUse c-style strings\n",0x18);
          lVar17 = 0x1a;
          pcVar18 = "\t\tCPP\tUse cpp STL strings\n";
LAB_00103dd2:
          iVar20 = 0;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar18,lVar17);
          goto LAB_00103974;
        }
        if ((pcVar18[1] == 'v') && (pcVar18[2] == '\0')) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Version is : ",0xd);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,str_ver_abi_cxx11_._M_dataplus._M_p,
                              str_ver_abi_cxx11_._M_string_length);
          local_328._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_328,1);
          goto LAB_00103971;
        }
        if ((pcVar18[1] == 'd') && (pcVar18[2] == '\0')) {
          local_329 = 1;
        }
        else {
          if ((pcVar18[1] == 'a') && (pcVar18[2] == '\0')) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Encrytion & Decryption algorithm :\n\n",0x24);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "[DESCRIPTION] As an argument we get a text message in the form of a string :\n"
                       ,0x4d);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tstring text_msg = \"Hello, World!\"\n\n",0x25);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "[DESCRIPTION] By definition string is a characters array\n",0x39);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 0] = \'H\'\t [ 7] = \'W\'\n",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 1] = \'e\'\t [ 8] = \'o\'\n",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 2] = \'l\'\t [ 9] = \'r\'\n",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 3] = \'l\'\t [10] = \'l\'\n",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 4] = \'o\'\t [11] = \'d\'\n",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 5] = \',\'\t [12] = \'!\'\n",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 6] = \' \'\n\n",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "[DESCRIPTION] Encryption & Decryption is performed one character at a time\n\n"
                       ,0x4c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "[DESCRIPTION] Two auxiliary unsigned character variables were created for Encryption & Decryption\n"
                       ,0x62);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tunsigned char a, b;\n\n",0x17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "[DESCRIPTION] The following actions are performed for each character\n",0x45
                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\ta = b = text_msg[n]\n",0x16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\ta = a << 4\n",0xd);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tb = b >> 4\n",0xd);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\ta = b = ~(a | b) - 1\n",0x17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\ta = a << 4\n",0xd);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tb = b >> 4\n",0xd);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tresult = a | b\n\n",0x12);
            lVar17 = 0x5d;
            pcVar18 = 
            "[DESCRIPTION] The Encryption or Decryption results for each character form the source string\n"
            ;
            goto LAB_00103dd2;
          }
          if ((pcVar18[1] == 't') && (pcVar18[2] == '\0')) {
            bVar2 = false;
          }
          else if ((pcVar18[1] == 'm') && (pcVar18[2] == '\0')) {
            pcVar18 = argv[(long)iVar20 + 1];
            if ((*pcVar18 == 'C') && (pcVar18[1] == '\0')) {
              local_2b8 = (_List_node_base *)0x0;
              iVar20 = iVar20 + 1;
            }
            else {
              iVar6 = strcmp(pcVar18,"CPP");
              p_Var11 = (_List_node_base *)CONCAT71((int7)((ulong)p_Var11 >> 8),1);
              iVar20 = iVar20 + 1;
              local_2b8 = p_Var11;
              if (iVar6 != 0) {
                iVar20 = 1;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"[ERROR] Incorrect string style mode\n",0x24);
                goto LAB_00103974;
              }
            }
          }
          else {
            if ((pcVar18[1] != 'o') || (pcVar18[2] != '\0')) goto LAB_00102cf6;
            if (((ulong)local_2c0 & 1) != 0) {
              iVar20 = 2;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"You can use only one output file\n",0x21);
              goto LAB_00103974;
            }
            std::ofstream::open((char *)&local_230,(_Ios_Openmode)argv[(long)iVar20 + 1]);
            iVar20 = iVar20 + 1;
            cVar5 = std::__basic_file<char>::is_open();
            p_Var11 = (_List_node_base *)CONCAT71((int7)((ulong)p_Var11 >> 8),1);
            local_2c0 = p_Var11;
            if (cVar5 == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Can\'t create or open output file\n",0x21);
            }
          }
        }
      }
      else {
LAB_00102cf6:
        std::__cxx11::string::string((string *)&local_328,pcVar18,(allocator *)&local_308);
        p_Var9 = (_List_node_base *)operator_new(0x30);
        p_Var11 = (_List_node_base *)local_328._M_string_length;
        p_Var9[1]._M_next = p_Var9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p == paVar1) {
          p_Var9[2]._M_next = (_List_node_base *)local_328.field_2._M_allocated_capacity;
          p_Var9[2]._M_prev = (_List_node_base *)local_328.field_2._8_8_;
        }
        else {
          p_Var9[1]._M_next = (_List_node_base *)local_328._M_dataplus._M_p;
          p_Var9[2]._M_next = (_List_node_base *)local_328.field_2._M_allocated_capacity;
        }
        p_Var9[1]._M_prev = (_List_node_base *)local_328._M_string_length;
        local_328._M_string_length = 0;
        local_328.field_2._M_allocated_capacity =
             local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_328._M_dataplus._M_p = (pointer)paVar1;
        std::__detail::_List_node_base::_M_hook(p_Var9);
        local_2b0._M_impl._M_node._M_size = local_2b0._M_impl._M_node._M_size + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != paVar1) {
          operator_delete(local_328._M_dataplus._M_p,
                          (ulong)(local_328.field_2._M_allocated_capacity + 1));
        }
      }
      iVar20 = iVar20 + 1;
    } while (iVar20 < argc);
  }
  if (local_329 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"[DEBUG] Debug output is ON\n\n",0x1c);
  }
  if ((local_329 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"[DEBUG] String mode : ",0x16);
    pcVar18 = "C\n\n";
    if (((ulong)local_2b8 & 1) != 0) {
      pcVar18 = "CPP\n\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,pcVar18,(ulong)((uint)local_2b8 & 1) * 2 + 3);
  }
  if ((local_329 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"[DEBUG] Output to file is ",0x1a);
    pcVar18 = "OFF\n\n";
    if (((ulong)local_2c0 & 1) != 0) {
      pcVar18 = "ON\n\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,pcVar18,(ulong)((uint)local_2c0 & 1) ^ 5);
  }
  if ((local_329 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"[DEBUG] Words analisys\n",0x17);
    if (local_2b0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_2b0) {
      p_Var11 = local_2b0._M_impl._M_node.super__List_node_base._M_next;
      do {
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_328,p_Var11[1]._M_next,
                   (long)&(p_Var11[1]._M_prev)->_M_next + (long)p_Var11[1]._M_next);
        local_308._0_1_ = (allocator)0x9;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::clog,(char *)&local_308,1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_328._M_dataplus._M_p,local_328._M_string_length);
        local_308 = (long *)CONCAT71(local_308._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_308,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,
                          (ulong)(local_328.field_2._M_allocated_capacity + 1));
        }
        p_Var11 = p_Var11->_M_next;
      } while (p_Var11 != (_List_node_base *)&local_2b0);
    }
  }
  if (bVar2) {
    while( true ) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nDo you want to set names for strings[y/n] : ",0x2d);
      uVar7 = _getch();
      p_Var11 = local_2b0._M_impl._M_node.super__List_node_base._M_next;
      if ((char)uVar7 == ' ') break;
      if ((uVar7 & 0xff) == 0x6e) goto LAB_0010311a;
      if ((uVar7 & 0xff) == 0x79) break;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Incorrect Answer! Try again!\n\n",0x1e);
    }
    if (bVar2) {
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"");
      if (local_2b0._M_impl._M_node._M_size != 0) {
        uVar21 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\nEnter name for ",0x10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)p_Var11[1]._M_next,
                              (long)p_Var11[1]._M_prev);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," : ",3);
          std::operator>>((istream *)&std::cin,(string *)&local_328);
          p_Var10 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_create_node<std::__cxx11::string_const&>
                              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_270,&local_328);
          std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
          local_270._M_impl._M_node._M_size = local_270._M_impl._M_node._M_size + 1;
          p_Var11 = p_Var11->_M_next;
          uVar21 = uVar21 + 1;
        } while (uVar21 < local_2b0._M_impl._M_node._M_size);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,
                        (ulong)(local_328.field_2._M_allocated_capacity + 1));
      }
      goto LAB_001032d4;
    }
  }
LAB_0010311a:
  if (local_2b0._M_impl._M_node._M_size != 0) {
    paVar1 = &local_328.field_2;
    uVar21 = 0;
    do {
      cVar5 = '\x01';
      if (9 < uVar21) {
        uVar14 = uVar21;
        cVar4 = '\x04';
        do {
          cVar5 = cVar4;
          if (uVar14 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_0010319b;
          }
          if (uVar14 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_0010319b;
          }
          if (uVar14 < 10000) goto LAB_0010319b;
          bVar2 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          cVar4 = cVar5 + '\x04';
        } while (bVar2);
        cVar5 = cVar5 + '\x01';
      }
LAB_0010319b:
      local_308 = &local_2f8;
      std::__cxx11::string::_M_construct((ulong)&local_308,cVar5);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_308,(uint)local_300,uVar21);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x105804);
      p_Var11 = (_List_node_base *)(plVar12 + 2);
      if ((_List_node_base *)*plVar12 == p_Var11) {
        local_328.field_2._M_allocated_capacity = (size_type)p_Var11->_M_next;
        local_328.field_2._8_8_ = plVar12[3];
        local_328._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_328.field_2._M_allocated_capacity = (size_type)p_Var11->_M_next;
        local_328._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_328._M_string_length = plVar12[1];
      *plVar12 = (long)p_Var11;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      p_Var11 = (_List_node_base *)operator_new(0x30);
      p_Var11[1]._M_next = p_Var11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p == paVar1) {
        p_Var11[2]._M_next = (_List_node_base *)local_328.field_2._M_allocated_capacity;
        p_Var11[2]._M_prev = (_List_node_base *)local_328.field_2._8_8_;
      }
      else {
        p_Var11[1]._M_next = (_List_node_base *)local_328._M_dataplus._M_p;
        p_Var11[2]._M_next = (_List_node_base *)local_328.field_2._M_allocated_capacity;
      }
      p_Var11[1]._M_prev = (_List_node_base *)local_328._M_string_length;
      local_328._M_string_length = 0;
      local_328.field_2._M_allocated_capacity =
           local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_328._M_dataplus._M_p = (pointer)paVar1;
      std::__detail::_List_node_base::_M_hook(p_Var11);
      local_270._M_impl._M_node._M_size = local_270._M_impl._M_node._M_size + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != paVar1) {
        operator_delete(local_328._M_dataplus._M_p,
                        (ulong)(local_328.field_2._M_allocated_capacity + 1));
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308,local_2f8 + 1);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < local_2b0._M_impl._M_node._M_size);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
LAB_001032d4:
  if (local_329 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"[DEBUG] Starting crypt\n\n",0x18);
  }
  if (local_2b0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_2b0) {
    p_Var11 = local_2b0._M_impl._M_node.super__List_node_base._M_next;
    do {
      cryptor::crypt((cryptor *)&local_328,(char *)(p_Var11 + 1),(char *)&local_329);
      std::__cxx11::string::operator=((string *)(p_Var11 + 1),(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,
                        (ulong)(local_328.field_2._M_allocated_capacity + 1));
      }
      p_Var11 = p_Var11->_M_next;
    } while (p_Var11 != (_List_node_base *)&local_2b0);
  }
  if (local_329 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"[DEBUG] Crypt result\n",0x15);
  }
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"");
  if (local_2b0._M_impl._M_node._M_size != 0) {
    uVar21 = 0;
    do {
      local_298 = (((_List_impl *)&local_298->_M_next)->_M_node).super__List_node_base._M_next;
      local_2c8 = (((_List_impl *)&local_2c8->_M_next)->_M_node).super__List_node_base._M_next;
      local_308 = (long *)CONCAT71(local_308._1_7_,9);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::clog,(char *)&local_308,1);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"th - ",5);
      local_238 = uVar21 + 1;
      if (((ulong)local_2b8 & 1) == 0) {
        std::operator+(&local_2e8,"char ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_298 + 1));
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e8);
        plVar15 = plVar12 + 2;
        if ((long *)*plVar12 == plVar15) {
          local_2f8 = *plVar15;
          lStack_2f0 = plVar12[3];
          local_308 = &local_2f8;
        }
        else {
          local_2f8 = *plVar15;
          local_308 = (long *)*plVar12;
        }
        local_300 = plVar12[1];
        *plVar12 = (long)plVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_328,(string *)&local_308);
        if (local_308 != &local_2f8) {
          operator_delete(local_308,local_2f8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        p_Var11 = local_2c8[1]._M_prev;
        if (p_Var11 != (_List_node_base *)0x0) {
          p_Var9 = (_List_node_base *)0x0;
          do {
            if (p_Var9 == (_List_node_base *)((long)&p_Var11[-1]._M_prev + 7)) {
              if (p_Var11 <= p_Var9) {
                std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                           p_Var9);
LAB_00103e3d:
                uVar13 = std::__throw_out_of_range_fmt
                                   ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                    ,p_Var9);
                std::__cxx11::
                _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_clear(&local_270);
                std::__cxx11::
                _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_clear(&local_2b0);
                std::ofstream::~ofstream(&local_230);
                _Unwind_Resume(uVar13);
              }
              cVar5 = *(char *)((long)&p_Var9->_M_next + (long)local_2c8[1]._M_next);
              uVar19 = (uint)cVar5;
              uVar7 = -uVar19;
              if (0 < (int)uVar19) {
                uVar7 = uVar19;
              }
              uVar3 = 3 - (uVar7 < 100);
              if (uVar7 < 10) {
                uVar3 = 1;
              }
              local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_2e8,(char)uVar3 - (cVar5 >> 7));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_2e8._M_dataplus._M_p + (uVar19 >> 0x1f),uVar3,uVar7);
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e8);
              plVar15 = plVar12 + 2;
              if ((long *)*plVar12 == plVar15) {
                local_2f8 = *plVar15;
                lStack_2f0 = plVar12[3];
                local_308 = &local_2f8;
              }
              else {
                local_2f8 = *plVar15;
                local_308 = (long *)*plVar12;
              }
              local_300 = plVar12[1];
              *plVar12 = (long)plVar15;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_308);
            }
            else {
              if (p_Var11 <= p_Var9) goto LAB_00103e3d;
              cVar5 = *(char *)((long)&p_Var9->_M_next + (long)local_2c8[1]._M_next);
              uVar19 = (uint)cVar5;
              uVar7 = -uVar19;
              if (0 < (int)uVar19) {
                uVar7 = uVar19;
              }
              uVar3 = 3 - (uVar7 < 100);
              if (uVar7 < 10) {
                uVar3 = 1;
              }
              local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_2e8,(char)uVar3 - (cVar5 >> 7));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_2e8._M_dataplus._M_p + (uVar19 >> 0x1f),uVar3,uVar7);
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e8);
              plVar15 = plVar12 + 2;
              if ((long *)*plVar12 == plVar15) {
                local_2f8 = *plVar15;
                lStack_2f0 = plVar12[3];
                local_308 = &local_2f8;
              }
              else {
                local_2f8 = *plVar15;
                local_308 = (long *)*plVar12;
              }
              local_300 = plVar12[1];
              *plVar12 = (long)plVar15;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_308);
            }
            if (local_308 != &local_2f8) {
              operator_delete(local_308,local_2f8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
              operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1
                             );
            }
            p_Var9 = (_List_node_base *)((long)&p_Var9->_M_next + 1);
            p_Var11 = local_2c8[1]._M_prev;
          } while (p_Var9 < p_Var11);
        }
      }
      else {
        std::operator+(&local_258,"std::string ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_298 + 1));
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_258);
        plVar15 = plVar12 + 2;
        if ((long *)*plVar12 == plVar15) {
          local_280 = *plVar15;
          lStack_278 = plVar12[3];
          local_290 = &local_280;
        }
        else {
          local_280 = *plVar15;
          local_290 = (long *)*plVar12;
        }
        local_288 = plVar12[1];
        *plVar12 = (long)plVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_290,(ulong)local_2c8[1]._M_next);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        psVar16 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_2e8.field_2._M_allocated_capacity = *psVar16;
          local_2e8.field_2._8_8_ = plVar12[3];
        }
        else {
          local_2e8.field_2._M_allocated_capacity = *psVar16;
          local_2e8._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_2e8._M_string_length = plVar12[1];
        *plVar12 = (long)psVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e8);
        plVar15 = plVar12 + 2;
        if ((long *)*plVar12 == plVar15) {
          local_2f8 = *plVar15;
          lStack_2f0 = plVar12[3];
          local_308 = &local_2f8;
        }
        else {
          local_2f8 = *plVar15;
          local_308 = (long *)*plVar12;
        }
        local_300 = plVar12[1];
        *plVar12 = (long)plVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_328,(string *)&local_308);
        if (local_308 != &local_2f8) {
          operator_delete(local_308,local_2f8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if (local_290 != &local_280) {
          operator_delete(local_290,local_280 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::clog,local_328._M_dataplus._M_p,
                          local_328._M_string_length);
      uVar21 = local_238;
      local_308 = (long *)CONCAT71(local_308._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_308,1);
      if (((ulong)local_2c0 & 1) != 0) {
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_328._M_dataplus._M_p,
                            local_328._M_string_length);
        local_308 = (long *)CONCAT71(local_308._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_308,1);
      }
    } while (uVar21 < local_2b0._M_impl._M_node._M_size);
  }
  if (((ulong)local_2c0 & 1) != 0) {
    std::ofstream::close();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,(ulong)(local_328.field_2._M_allocated_capacity + 1))
    ;
  }
LAB_00103971:
  iVar20 = 0;
LAB_00103974:
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_270);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_2b0);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _push_back;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return iVar20;
}

Assistant:

int main(int argc, char * argv[]) {
    std::cout << "                                    _             \tVersion : " << str_ver << "\n";
    std::cout << "   ||  ||      ___ _ __ _   _ _ __ | |_ ___  _ __ \n";
    std::cout << "   \\\\()//    / __| '__| | | | '_ \\| __/ _ \\| '__|\tDeveloper : KonstantIMP\n";
    std::cout << "  //(__)\\\\  | (__| |  | |_| | |_) | || (_) | |   \tFeedback email : mihedovkos@gmail.com\n";
    std::cout << "  ||    ||   \\___|_|   \\__, | .__/ \\__\\___/|_|   \n";
    std::cout << "                       |___/|_|                  \tUse \"cryptor -h\" to view help message\n\n";

    if(argc == 1) {
        return 0;
    }

    bool mode = 0;
    bool debug = 0;
    bool f_out = 0;
    bool ask_name = true;

    std::ofstream fout;

    std::list<std::string> c_word;
    std::list<std::string> s_name;

    for(int i{1}; i < argc; i++) {
        if(strcmp(argv[i], "-h") == 0) {
            std::cout << "CRYPTOR : version " << str_ver << "\n\n";

            std::cout << "Cryptor is a simple programm, to encrypt & decrypt text messages\n\n";

            std::cout << "HELP MANUAL :\n";
            std::cout << "\t[USAGE] encryptor [OPTIONS] [WORDS]\n\n";

            std::cout << "[OPTIONS]\n";
            std::cout << "\t-d\tView debug output\n";
            std::cout << "\t-v\tView version and exit\n";
            std::cout << "\t-h\tView help message and exit\n";
            std::cout << "\t-a\tView (en/de)crypt algorithm and exit\n";
            std::cout << "\t-t\tDon't ask about stings names\n";

            std::cout << "\t-o [F]\tSet output file\n\n";

            std::cout << "\t-m [M]\tSet output strings style\n";

            std::cout << "\t[STRING STYLE MODES]\n";
            std::cout << "\t\tC\tUse c-style strings\n";
            std::cout << "\t\tCPP\tUse cpp STL strings\n";

            return 0;
        }
        if(strcmp(argv[i], "-v") == 0) {
            std::cout << "Version is : " << str_ver << '\n';
            return 0;
        }
        if(strcmp(argv[i], "-d") == 0) {
            debug = true; continue;
        }
        if(strcmp(argv[i], "-a") == 0) {
            std::cout << "Encrytion & Decryption algorithm :\n\n";

            std::cout << "[DESCRIPTION] As an argument we get a text message in the form of a string :\n";
            std::cout << "\t\tstring text_msg = \"Hello, World!\"\n\n";

            std::cout << "[DESCRIPTION] By definition string is a characters array\n";
            std::cout << "\t\t[ 0] = 'H'\t [ 7] = 'W'\n";
            std::cout << "\t\t[ 1] = 'e'\t [ 8] = 'o'\n";
            std::cout << "\t\t[ 2] = 'l'\t [ 9] = 'r'\n";
            std::cout << "\t\t[ 3] = 'l'\t [10] = 'l'\n";
            std::cout << "\t\t[ 4] = 'o'\t [11] = 'd'\n";
            std::cout << "\t\t[ 5] = ','\t [12] = '!'\n";
            std::cout << "\t\t[ 6] = ' '\n\n";

            std::cout << "[DESCRIPTION] Encryption & Decryption is performed one character at a time\n\n";

            std::cout << "[DESCRIPTION] Two auxiliary unsigned character variables were created for Encryption & Decryption\n";
            std::cout << "\t\tunsigned char a, b;\n\n";

            std::cout << "[DESCRIPTION] The following actions are performed for each character\n";
            std::cout << "\t\ta = b = text_msg[n]\n";
            std::cout << "\t\ta = a << 4\n";
            std::cout << "\t\tb = b >> 4\n";
            std::cout << "\t\ta = b = ~(a | b) - 1\n";
            std::cout << "\t\ta = a << 4\n";
            std::cout << "\t\tb = b >> 4\n";
            std::cout << "\t\tresult = a | b\n\n";

            std::cout << "[DESCRIPTION] The Encryption or Decryption results for each character form the source string\n";

            return 0;
        }
        if(strcmp(argv[i], "-t") == 0) {
            ask_name = false; continue;
        }
        if(strcmp(argv[i], "-m") == 0) {
            i++;

            if(strcmp(argv[i], "C") == 0) mode = 0;
            else if(strcmp(argv[i], "CPP") == 0) mode = 1;
            else {
                std::cout << "[ERROR] Incorrect string style mode\n";
                return 1;
            }

            continue;
        }
        if(strcmp(argv[i], "-o") == 0) {
            if(f_out) {
                std::cout << "You can use only one output file\n";
                return 2;
            }

            f_out = true; i++;

            fout.open(argv[i], std::ios_base::app);

            if(!fout.is_open()) {
                std::cout << "Can't create or open output file\n";
            }

            continue;
        }

        c_word.push_back(argv[i]);
    }

    if(debug) std::clog << "[DEBUG] Debug output is ON\n\n";

    if(debug) std::clog << "[DEBUG] String mode : " << (mode ? "CPP\n\n" : "C\n\n");

    if(debug) std::clog << "[DEBUG] Output to file is " << (f_out ? "ON\n\n" : "OFF\n\n");

    if(debug) {
        std::clog << "[DEBUG] Words analisys\n";

        for(auto iter : c_word) std::clog << '\t' << iter << '\n';
    }

    if(ask_name) {
        bool set = false; char ans = 0;

        do {
            std::cout << "\nDo you want to set names for strings[y/n] : ";
            ans = static_cast<char>(_getch());

            if(ans == 'n') {
                ask_name = false;
                set = true;
            }
            else if(ans == 'y' || ans == ' ') set = true;
            else std::cout << "Incorrect Answer! Try again!\n\n";
        } while(set == false);
    }

    if(ask_name) {
        auto iter = c_word.begin();

        std::string tmp = "";

        for(std::size_t i{0}; i < c_word.size(); i++) {
            std::cout << "\nEnter name for " << *iter << " : ";
            std::cin >> tmp;

            s_name.push_back(tmp);

            iter++;
        }
    }
    else {
        for(std::size_t i{0}; i < c_word.size(); i++) s_name.push_back("str" + std::to_string(i));

        std::cout << "\n";
    }

    if(debug) std::clog << "[DEBUG] Starting crypt\n\n";

    for(auto & iter : c_word) iter = cryptor::crypt(iter, debug);

    if(debug) std::clog << "[DEBUG] Crypt result\n";

    std::string tmp = ""; auto iter = c_word.begin();
    auto name_iter = s_name.begin();

    for(std::size_t i{0}; i < c_word.size(); i++) {
        std::clog << '\t' << i + 1 << "th - ";

        if(mode) {
            tmp = "std::string " + *name_iter + " = \"" + *iter + "\";";
        }
        else {
            tmp = "char " + *name_iter + "[] = {";

            for(std::size_t j{0}; j < (*iter).length(); j++) {
                if(j != ((*iter).length() - 1)) tmp += std::to_string(static_cast<int>((*iter).at(j))) + ", ";
                else tmp += std::to_string(static_cast<int>((*iter).at(j))) + ", 0 };";
            }
        }

        std::clog << tmp << '\n';

        if(f_out) fout << tmp << '\n';

        iter++; name_iter++;
    }

    if(f_out) fout.close();

	return 0;
}